

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

void __thiscall QAbstractButton::mouseMoveEvent(QAbstractButton *this,QMouseEvent *e)

{
  QAbstractButtonPrivate *this_00;
  QMouseEvent QVar1;
  char cVar2;
  long in_FS_OFFSET;
  QPointF local_38;
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)e[0x44] & 1) == 0) ||
     (this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8,
     (this_00->field_0x28c & 0x40) == 0)) {
LAB_0039c3e3:
    QVar1 = (QMouseEvent)0x0;
  }
  else {
    local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
    local_28 = QPointF::toPoint(&local_38);
    cVar2 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
    if (((this_00->field_0x28c & 0x10) == 0) != (bool)cVar2) {
      local_38 = QSinglePointEvent::position((QSinglePointEvent *)e);
      local_28 = QPointF::toPoint(&local_38);
      cVar2 = (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this);
      if (cVar2 != '\0') goto LAB_0039c3e8;
      goto LAB_0039c3e3;
    }
    setDown(this,(this_00->field_0x28c & 0x10) == 0);
    QWidget::repaint(&this->super_QWidget);
    if ((this_00->field_0x28c & 0x10) == 0) {
      QAbstractButtonPrivate::emitReleased(this_00);
    }
    else {
      QAbstractButtonPrivate::emitPressed(this_00);
    }
    QVar1 = (QMouseEvent)0x1;
  }
  e[0xc] = QVar1;
LAB_0039c3e8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractButton::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QAbstractButton);
    if (!(e->buttons() & Qt::LeftButton) || !d->pressed) {
        e->ignore();
        return;
    }

    if (hitButton(e->position().toPoint()) != d->down) {
        setDown(!d->down);
        repaint();
        if (d->down)
            d->emitPressed();
        else
            d->emitReleased();
        e->accept();
    } else if (!hitButton(e->position().toPoint())) {
        e->ignore();
    }
}